

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O0

void __thiscall icu_63::UnifiedCache::removeSoftRef(UnifiedCache *this,SharedObject *value)

{
  UBool UVar1;
  int iVar2;
  SharedObject *value_local;
  UnifiedCache *this_local;
  
  iVar2 = value->softRefCount + -1;
  value->softRefCount = iVar2;
  if (iVar2 == 0) {
    this->fNumValuesTotal = this->fNumValuesTotal + -1;
    UVar1 = SharedObject::noHardReferences(value);
    if (UVar1 == '\0') {
      value->cachePtr = (UnifiedCacheBase *)0x0;
    }
    else if (value != (SharedObject *)0x0) {
      (*(value->super_UObject)._vptr_UObject[1])();
    }
  }
  return;
}

Assistant:

void UnifiedCache::removeSoftRef(const SharedObject *value) const {
    U_ASSERT(value->cachePtr == this);
    U_ASSERT(value->softRefCount > 0);
    if (--value->softRefCount == 0) {
        --fNumValuesTotal;
        if (value->noHardReferences()) {
            delete value;
        } else {
            // This path only happens from flush(all). Which only happens from the
            // UnifiedCache destructor.  Nulling out value.cacheptr changes the behavior
            // of value.removeRef(), causing the deletion to be done there.
            value->cachePtr = nullptr;
        }
    }
}